

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_struct::dump(statement_struct *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  _Map_pointer pppsVar3;
  _Elt_pointer ppsVar4;
  statement_base **ptr;
  _Elt_pointer ppsVar5;
  
  poVar2 = std::operator<<(o,"< BeginStruct: ID = \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->mName);
  std::operator<<(poVar2,"\"");
  if ((this->mParent).mRoot != (tree_node *)0x0) {
    std::operator<<(o,", Parent = ");
    compiler_type::dump_expr((this->mParent).mRoot,o);
  }
  std::operator<<(o," >\n");
  ppsVar5 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar3 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar5 != ppsVar1) {
    (*(*ppsVar5)->_vptr_statement_base[5])(*ppsVar5,o);
    ppsVar5 = ppsVar5 + 1;
    if (ppsVar5 == ppsVar4) {
      ppsVar5 = pppsVar3[1];
      pppsVar3 = pppsVar3 + 1;
      ppsVar4 = ppsVar5 + 0x40;
    }
  }
  std::operator<<(o,"< EndStruct >\n");
  return;
}

Assistant:

void statement_struct::dump(std::ostream &o) const
	{
		o << "< BeginStruct: ID = \"" << mName << "\"";
		if (mParent.root().usable()) {
			o << ", Parent = ";
			compiler_type::dump_expr(mParent.root(), o);
		}
		o << " >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndStruct >\n";
	}